

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

bool __thiscall toml::internal::Parser::parseArray(Parser *this,Value *v)

{
  TokenType TVar1;
  Value *pVVar2;
  bool bVar3;
  int iVar4;
  Array a;
  Value x;
  string local_88;
  vector<toml::Value,_std::allocator<toml::Value>_> local_68;
  Value local_48;
  Value *local_38;
  
  if ((this->token_).type_ != LBRACKET) {
    return false;
  }
  local_38 = v;
  nextValue(this);
  local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    while ((this->token_).type_ == END_OF_LINE) {
      nextValue(this);
    }
    TVar1 = (this->token_).type_;
    if (TVar1 == END_OF_LINE) {
      do {
        nextValue(this);
      } while ((this->token_).type_ == END_OF_LINE);
    }
    else if (TVar1 == RBRACKET) goto LAB_00137b69;
    local_48.type_ = NULL_TYPE;
    local_48.field_1.null_ = (void *)0x0;
    bVar3 = parseValue(this,&local_48);
    iVar4 = 1;
    if (bVar3) {
      if ((local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
           super__Vector_impl_data._M_start ==
           local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         ((local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
           super__Vector_impl_data._M_start)->type_ == local_48.type_)) {
        std::vector<toml::Value,_std::allocator<toml::Value>_>::emplace_back<toml::Value>
                  (&local_68,&local_48);
        while ((this->token_).type_ == END_OF_LINE) {
          nextValue(this);
        }
        TVar1 = (this->token_).type_;
        if (TVar1 == RBRACKET) {
          iVar4 = 3;
        }
        else {
          iVar4 = 0;
          if (TVar1 == COMMA) {
            nextValue(this);
            iVar4 = 0;
          }
        }
      }
      else {
        local_88._M_dataplus._M_p = (pointer)((long)&local_88 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"type check failed","");
        addError(this,&local_88);
        if (local_88._M_dataplus._M_p != (pointer)((long)&local_88 + 0x10)) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
    }
    Value::~Value(&local_48);
  } while (iVar4 == 0);
  if (iVar4 == 3) {
LAB_00137b69:
    if ((this->token_).type_ == RBRACKET) {
      nextValue(this);
      local_88._M_dataplus._M_p._0_4_ = 6;
      local_88._M_string_length = (size_type)operator_new(0x18);
      pVVar2 = local_38;
      (((_Vector_base<toml::Value,_std::allocator<toml::Value>_> *)
       &((string *)local_88._M_string_length)->_M_dataplus)->_M_impl).super__Vector_impl_data.
      _M_start = local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (((Array *)local_88._M_string_length)->
      super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.super__Vector_impl_data
      ._M_finish = local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (((Array *)local_88._M_string_length)->
      super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((Value *)&local_88 != local_38) {
        Value::~Value(local_38);
        pVVar2->type_ = (Type)local_88._M_dataplus._M_p;
        switch((ulong)local_88._M_dataplus._M_p & 0xffffffff) {
        case 0:
        case 2:
        case 4:
        case 5:
        case 6:
        case 7:
          (pVVar2->field_1).array_ = (Array *)local_88._M_string_length;
          break;
        case 1:
          (pVVar2->field_1).bool_ = (bool)(undefined1)local_88._M_string_length;
          break;
        case 3:
          (pVVar2->field_1).array_ = (Array *)local_88._M_string_length;
          break;
        default:
          pVVar2->type_ = NULL_TYPE;
          (pVVar2->field_1).null_ = (void *)0x0;
        }
        local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
        local_88._M_string_length = 0;
      }
      Value::~Value((Value *)&local_88);
      bVar3 = true;
      goto LAB_00137c17;
    }
  }
  bVar3 = false;
LAB_00137c17:
  std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(&local_68);
  return bVar3;
}

Assistant:

inline bool Parser::consumeForValue(TokenType type)
{
    if (token().type() == type) {
        nextValue();
        return true;
    }

    return false;
}